

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::vector<unsigned_char>::assign(vector<unsigned_char> *this,vector<unsigned_char> *other)

{
  bool bVar1;
  vector<unsigned_char> *other_local;
  vector<unsigned_char> *this_local;
  
  if (this != other) {
    if (this->m_capacity == other->m_size) {
      resize(this,0);
    }
    else {
      clear(this);
      bVar1 = increase_capacity(this,other->m_size,false);
      if (!bVar1) {
        return false;
      }
    }
    memcpy(this->m_p,other->m_p,(ulong)other->m_size);
    this->m_size = other->m_size;
  }
  return true;
}

Assistant:

inline bool assign(const vector& other)
        {
            if (this == &other)
                return true;

            if (m_capacity == other.m_size)
                resize(0);
            else
            {
                clear();

                if (!increase_capacity(other.m_size, false))
                    return false;
            }

            if (scalar_type<T>::cFlag)
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint32 i = other.m_size; i > 0; i--)
                    helpers::construct(pDst++, *pSrc++);
            }

            m_size = other.m_size;

            return true;
        }